

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStructMatrix.cpp
# Opt level: O3

void __thiscall TPZStructMatrix::Write(TPZStructMatrix *this,TPZStream *buf,int withclassid)

{
  TPZCompMesh *pTVar1;
  TPZSavable *pTVar2;
  
  pTVar1 = this->fMesh;
  if (pTVar1 == (TPZCompMesh *)0x0) {
    pTVar2 = (TPZSavable *)0x0;
  }
  else {
    pTVar2 = (TPZSavable *)
             ((long)(pTVar1->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fVec.fExtAlloc +
             *(long *)(*(long *)pTVar1 + -0x60) + -0x70);
  }
  TPZPersistenceManager::WritePointer(pTVar2,buf);
  pTVar1 = ((this->fCompMesh).fRef)->fPointer;
  if (pTVar1 == (TPZCompMesh *)0x0) {
    pTVar2 = (TPZSavable *)0x0;
  }
  else {
    pTVar2 = (TPZSavable *)
             ((long)(pTVar1->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fVec.fExtAlloc +
             *(long *)(*(long *)pTVar1 + -0x60) + -0x70);
  }
  TPZPersistenceManager::WritePointer(pTVar2,buf);
  TPZStream::Write<int>(buf,&this->fMaterialIds);
  TPZEquationFilter::Write(&this->fEquationFilter,buf,withclassid);
  return;
}

Assistant:

void TPZStructMatrix::Write(TPZStream& buf, int withclassid) const {
    //DO NOT WRITE THE TPZMATPARINTERFACE
    TPZPersistenceManager::WritePointer(fMesh, &buf);
    TPZPersistenceManager::WritePointer(fCompMesh.operator ->(), &buf);
    buf.Write(fMaterialIds);
    fEquationFilter.Write(buf,withclassid);
}